

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O3

double __thiscall Js::BigUInt::GetDbl(BigUInt *this)

{
  uint32 lu;
  int iVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  double in_RAX;
  undefined4 *puVar7;
  uint32 *puVar8;
  byte bVar9;
  uint uVar10;
  double local_38;
  double dbl;
  
  iVar4 = this->m_clu;
  if (iVar4 == 0) {
    local_38 = 0.0;
  }
  else {
    if (iVar4 == 2) {
      local_38 = (double)this->m_prglu[1];
      puVar8 = NumberUtilities::LuHiDbl(&local_38);
      *puVar8 = *puVar8 + 0x2000000;
      return (double)*this->m_prglu + local_38;
    }
    if (iVar4 == 1) {
      return (double)*this->m_prglu;
    }
    local_38 = in_RAX;
    if (iVar4 < 3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x215,"(3 <= m_clu)","3 <= m_clu");
      if (!bVar3) goto LAB_0068ebed;
      *puVar7 = 0;
      iVar4 = this->m_clu;
    }
    if (iVar4 < 0x21) {
      puVar8 = this->m_prglu;
      lu = puVar8[iVar4 + -1];
      uVar6 = puVar8[iVar4 + -2];
      uVar5 = puVar8[iVar4 + -3];
      if (lu == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                    ,0x221,"(0 != lu1)","0 != lu1");
        if (!bVar3) {
LAB_0068ebed:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar7 = 0;
      }
      iVar4 = NumberUtilities::CbitZeroLeft(lu);
      uVar10 = uVar6;
      if (iVar4 != 0x1f) {
        bVar9 = (char)iVar4 + 1;
        uVar10 = lu << (bVar9 & 0x1f) | uVar6 >> 0x20 - (bVar9 & 0x1f);
        uVar5 = (uint)(uVar5 << (bVar9 & 0x1f) != 0) |
                uVar6 << (bVar9 & 0x1f) | uVar5 >> 0x20 - (bVar9 & 0x1f);
      }
      puVar8 = NumberUtilities::LuHiDbl(&local_38);
      *puVar8 = uVar10 >> 0xc;
      puVar8 = NumberUtilities::LuLoDbl(&local_38);
      *puVar8 = uVar10 << 0x14 | uVar5 >> 0xc;
      iVar1 = this->m_clu;
      puVar8 = NumberUtilities::LuHiDbl(&local_38);
      *puVar8 = *puVar8 | iVar1 * 0x2000000 + iVar4 * -0x100000 + 0x3fe00000U;
      if ((uVar5 >> 0xb & 1) != 0) {
        if (((uVar5 & 0x7ff) == 0) &&
           (puVar8 = NumberUtilities::LuLoDbl(&local_38), (*puVar8 & 1) == 0)) {
          uVar6 = this->m_clu - 4;
          if (-1 < (int)uVar6) {
            do {
              if (this->m_prglu[uVar6] != 0) goto LAB_0068ebc1;
              bVar3 = 0 < (int)uVar6;
              uVar6 = uVar6 - 1;
            } while (bVar3);
          }
        }
        else {
LAB_0068ebc1:
          puVar8 = NumberUtilities::LuLoDbl(&local_38);
          *puVar8 = *puVar8 + 1;
          if (*puVar8 == 0) {
            puVar8 = NumberUtilities::LuHiDbl(&local_38);
            *puVar8 = *puVar8 + 1;
          }
        }
      }
    }
    else {
      puVar8 = NumberUtilities::LuHiDbl(&local_38);
      *puVar8 = 0x7ff00000;
      puVar8 = NumberUtilities::LuLoDbl(&local_38);
      *puVar8 = 0;
    }
  }
  return local_38;
}

Assistant:

double BigUInt::GetDbl(void)
    {
        double dbl;
        uint32 luHi, luLo;
        uint32 lu1, lu2, lu3;
        int32 ilu;
        int cbit;

        switch (m_clu)
        {
        case 0:
            return 0;
        case 1:
            return m_prglu[0];
        case 2:
            dbl = m_prglu[1];
            NumberUtilities::LuHiDbl(dbl) += 0x02000000;
            return dbl + m_prglu[0];
        }

        Assert(3 <= m_clu);
        if (m_clu > 32)
        {
            // Result is infinite.
            NumberUtilities::LuHiDbl(dbl) = 0x7FF00000;
            NumberUtilities::LuLoDbl(dbl) = 0;
            return dbl;
        }

        lu1 = m_prglu[m_clu - 1];
        lu2 = m_prglu[m_clu - 2];
        lu3 = m_prglu[m_clu - 3];
        Assert(0 != lu1);
        cbit = 31 - NumberUtilities::CbitZeroLeft(lu1);

        if (cbit == 0)
        {
            luHi = lu2;
            luLo = lu3;
        }
        else
        {
            luHi = (lu1 << (32 - cbit)) | (lu2 >> cbit);
            // Or 1 if there are any remaining nonzero bits in lu3, so we take
            // them into account when rounding.
            luLo = (lu2 << (32 - cbit)) | (lu3 >> cbit) | (0 != (lu3 << (32 - cbit)));
        }

        // Set the mantissa bits.
        NumberUtilities::LuHiDbl(dbl) = luHi >> 12;
        NumberUtilities::LuLoDbl(dbl) = (luHi << 20) | (luLo >> 12);

        // Set the exponent field.
        NumberUtilities::LuHiDbl(dbl) |= (0x03FF + cbit + (m_clu - 1) * 0x0020) << 20;

        // Do IEEE rounding.
        if (luLo & 0x0800)
        {
            if ((luLo & 0x07FF) || (NumberUtilities::LuLoDbl(dbl) & 1))
            {
                if (0 == ++NumberUtilities::LuLoDbl(dbl))
                    ++NumberUtilities::LuHiDbl(dbl);
            }
            else
            {
                // If there are any non-zero bits in m_prglu from 0 to m_clu - 4, round up.
                for (ilu = m_clu - 4; ilu >= 0; ilu--)
                {
                    if (0 != m_prglu[ilu])
                    {
                        if (0 == ++NumberUtilities::LuLoDbl(dbl))
                            ++NumberUtilities::LuHiDbl(dbl);
                        break;
                    }
                }
            }
        }

        return dbl;
    }